

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat3 * dja::transpose(mat3 *m)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  float_t fVar6;
  float_t fVar7;
  float_t fVar8;
  mat3 *in_RDI;
  
  fVar1 = m->m[2].z;
  fVar2 = m->m[0].y;
  fVar3 = m->m[0].z;
  fVar4 = m->m[1].x;
  fVar5 = m->m[1].y;
  fVar6 = m->m[1].z;
  fVar7 = m->m[2].x;
  fVar8 = m->m[2].y;
  in_RDI->m[0].x = m->m[0].x;
  in_RDI->m[0].y = fVar4;
  in_RDI->m[0].z = fVar7;
  in_RDI->m[1].x = fVar2;
  in_RDI->m[1].y = fVar5;
  in_RDI->m[1].z = fVar8;
  in_RDI->m[2].x = fVar3;
  in_RDI->m[2].y = fVar6;
  in_RDI->m[2].z = fVar1;
  return in_RDI;
}

Assistant:

mat3 transpose(const mat3& m)
{
    return mat3(M00(m), M10(m), M20(m),
                M01(m), M11(m), M21(m),
                M02(m), M12(m), M22(m));
}